

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

string * utf8_to_gbk(string *utf8)

{
  string *in_RSI;
  string *utf8_local;
  string *out;
  
  std::__cxx11::string::string((string *)utf8);
  utf8_to_gbk(in_RSI,utf8);
  return utf8;
}

Assistant:

std::string utf8_to_gbk(const std::string& utf8)
{
    std::string out;
    utf8_to_gbk(utf8, &out);
    return out;
}